

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

void __thiscall
leveldb::log::LogTest::CheckOffsetPastEndReturnsNoRecords(LogTest *this,uint64_t offset_past_end)

{
  bool bVar1;
  Reader *this_00;
  size_t sVar2;
  Tester local_210;
  string local_70 [8];
  string scratch;
  undefined1 local_50 [8];
  Slice record;
  Reader *offset_reader;
  size_t sStack_20;
  uint64_t local_18;
  uint64_t offset_past_end_local;
  LogTest *this_local;
  
  local_18 = offset_past_end;
  offset_past_end_local = (uint64_t)this;
  WriteInitialOffsetLog(this);
  this->reading_ = true;
  Slice::Slice((Slice *)&offset_reader,&(this->dest_).contents_);
  (this->source_).contents_.data_ = (char *)offset_reader;
  (this->source_).contents_.size_ = sStack_20;
  this_00 = (Reader *)operator_new(0x58);
  sVar2 = WrittenBytes(this);
  Reader::Reader(this_00,&(this->source_).super_SequentialFile,&(this->report_).super_Reporter,true,
                 sVar2 + local_18);
  Slice::Slice((Slice *)local_50);
  std::__cxx11::string::string(local_70);
  test::Tester::Tester
            (&local_210,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x85);
  bVar1 = Reader::ReadRecord(this_00,(Slice *)local_50,(string *)local_70);
  test::Tester::Is(&local_210,(bool)(~bVar1 & 1),"!offset_reader->ReadRecord(&record, &scratch)");
  test::Tester::~Tester(&local_210);
  if (this_00 != (Reader *)0x0) {
    Reader::~Reader(this_00);
    operator_delete(this_00);
  }
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

void CheckOffsetPastEndReturnsNoRecords(uint64_t offset_past_end) {
    WriteInitialOffsetLog();
    reading_ = true;
    source_.contents_ = Slice(dest_.contents_);
    Reader* offset_reader = new Reader(&source_, &report_, true /*checksum*/,
                                       WrittenBytes() + offset_past_end);
    Slice record;
    std::string scratch;
    ASSERT_TRUE(!offset_reader->ReadRecord(&record, &scratch));
    delete offset_reader;
  }